

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Rget_accumulate
              (void *origin_addr,int origin_count,MPIABI_Datatype origin_datatype,void *result_addr,
              int result_count,MPIABI_Datatype result_datatype,int target_rank,
              MPIABI_Aint target_disp,int target_count,MPIABI_Datatype target_datatype,MPIABI_Op op,
              MPIABI_Win win,MPIABI_Request *request)

{
  void *pvVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_datatype_t *poVar4;
  ompi_datatype_t *poVar5;
  ompi_op_t *poVar6;
  ompi_win_t *poVar7;
  ompi_request_t **ppoVar8;
  WPI_HandlePtr<ompi_request_t_*> local_90;
  WPI_Handle local_88 [8];
  WPI_Handle local_80 [8];
  WPI_Handle local_78 [8];
  WPI_Handle local_70 [8];
  WPI_Handle local_68 [8];
  MPIABI_Datatype local_60;
  MPIABI_Datatype result_datatype_local;
  void *pvStack_50;
  int result_count_local;
  void *result_addr_local;
  MPIABI_Datatype origin_datatype_local;
  void *pvStack_38;
  int origin_count_local;
  void *origin_addr_local;
  
  local_60 = result_datatype;
  result_datatype_local._4_4_ = result_count;
  pvStack_50 = result_addr;
  result_addr_local = (void *)origin_datatype;
  origin_datatype_local._4_4_ = origin_count;
  pvStack_38 = origin_addr;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_68,origin_datatype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_68);
  pvVar1 = pvStack_50;
  iVar2 = result_datatype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_70,local_60);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_70);
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_78,target_datatype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_78);
  WPI_Handle<ompi_op_t_*>::WPI_Handle((WPI_Handle<ompi_op_t_*> *)local_80,op);
  poVar6 = WPI_Handle::operator_cast_to_ompi_op_t_(local_80);
  WPI_Handle<ompi_win_t_*>::WPI_Handle((WPI_Handle<ompi_win_t_*> *)local_88,win);
  poVar7 = WPI_Handle::operator_cast_to_ompi_win_t_(local_88);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_90,request);
  ppoVar8 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_90);
  iVar2 = MPI_Rget_accumulate(origin_addr,origin_count,poVar3,pvVar1,iVar2,poVar4,target_rank,
                              target_disp,target_count,poVar5,poVar6,poVar7,ppoVar8);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_90);
  return iVar2;
}

Assistant:

int MPIABI_Rget_accumulate(
  const void * origin_addr,
  int origin_count,
  MPIABI_Datatype origin_datatype,
  void * result_addr,
  int result_count,
  MPIABI_Datatype result_datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  int target_count,
  MPIABI_Datatype target_datatype,
  MPIABI_Op op,
  MPIABI_Win win,
  MPIABI_Request * request
) {
  return MPI_Rget_accumulate(
    origin_addr,
    origin_count,
    (MPI_Datatype)(WPI_Datatype)origin_datatype,
    result_addr,
    result_count,
    (MPI_Datatype)(WPI_Datatype)result_datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    target_count,
    (MPI_Datatype)(WPI_Datatype)target_datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Win)(WPI_Win)win,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}